

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_word.c
# Opt level: O2

int BN_sub_word(BIGNUM *a,ulong w)

{
  ulong *puVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  iVar4 = 1;
  if (w != 0) {
    iVar3 = BN_is_zero((BIGNUM *)a);
    if (iVar3 == 0) {
      if (a->neg == 0) {
        iVar3 = a->top;
        puVar1 = a->d;
        if ((iVar3 == 1) && (*puVar1 <= w && w - *puVar1 != 0)) {
          *puVar1 = w - *puVar1;
          a->neg = 1;
        }
        else {
          lVar5 = 0;
          while( true ) {
            uVar2 = puVar1[lVar5];
            if (w <= uVar2) break;
            puVar1[lVar5] = uVar2 - w;
            lVar5 = lVar5 + 1;
            w = 1;
          }
          puVar1[lVar5] = uVar2 - w;
          if ((uVar2 - w == 0) && (iVar3 + -1 == (int)lVar5)) {
            a->top = (int)lVar5;
          }
        }
      }
      else {
        a->neg = 0;
        iVar4 = BN_add_word(a,w);
        a->neg = 1;
      }
    }
    else {
      iVar4 = BN_set_word(a,w);
      if (iVar4 == 0) {
        iVar4 = 0;
      }
      else {
        BN_set_negative(a,1);
      }
    }
  }
  return iVar4;
}

Assistant:

int BN_sub_word(BIGNUM *a, BN_ULONG w)
{
    int i;

    bn_check_top(a);
    w &= BN_MASK2;

    /* degenerate case: w is zero */
    if (!w)
        return 1;
    /* degenerate case: a is zero */
    if (BN_is_zero(a)) {
        i = BN_set_word(a, w);
        if (i != 0)
            BN_set_negative(a, 1);
        return i;
    }
    /* handle 'a' when negative */
    if (a->neg) {
        a->neg = 0;
        i = BN_add_word(a, w);
        a->neg = 1;
        return (i);
    }

    if ((a->top == 1) && (a->d[0] < w)) {
        a->d[0] = w - a->d[0];
        a->neg = 1;
        return (1);
    }
    i = 0;
    for (;;) {
        if (a->d[i] >= w) {
            a->d[i] -= w;
            break;
        } else {
            a->d[i] = (a->d[i] - w) & BN_MASK2;
            i++;
            w = 1;
        }
    }
    if ((a->d[i] == 0) && (i == (a->top - 1)))
        a->top--;
    bn_check_top(a);
    return (1);
}